

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void LD_mangle(uchar *key,uchar *ret_key,int nbytes)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = nbytes + -1;
  uVar1 = (ulong)(uint)(~(nbytes >> 0x1f) & nbytes) << 3;
  uVar4 = 0;
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 8) {
    uVar4 = uVar4 | (uint)key[iVar3] << ((uint)uVar2 & 0x1f);
    iVar3 = iVar3 + -1;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 8) {
    *ret_key = (uchar)(uVar4 * 0x7c32b16d >> (uVar2 & 0x3f));
    ret_key = ret_key + 1;
  }
  return;
}

Assistant:

void LD_mangle(const unsigned char* key, unsigned char* ret_key,
	int nbytes) {
	unsigned long long new_key = 0;
	int i;
	for (i = 0; i < nbytes; ++i) {
		new_key |= key[nbytes - i - 1] << (i * 8);
	}
	new_key = (new_key * 2083697005) & (0xffffffff);
	for (i = 0; i < nbytes; ++i) {
		ret_key[i] = (new_key >> (i * 8)) & 0xff;
	}
}